

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_structs.c
# Opt level: O0

ulp_ring_private_key * ulp_ring_alloc_private_key(size_t n)

{
  uint64_t *puVar1;
  size_t in_RDI;
  ulp_ring_private_key *key;
  ulp_ring_private_key *local_8;
  
  local_8 = (ulp_ring_private_key *)malloc(0x18);
  if (local_8 == (ulp_ring_private_key *)0x0) {
    local_8 = (ulp_ring_private_key *)0x0;
  }
  else {
    local_8->n = in_RDI;
    puVar1 = (uint64_t *)malloc(in_RDI << 3);
    local_8->s = puVar1;
    if (local_8->s == (uint64_t *)0x0) {
      free(local_8);
      local_8 = (ulp_ring_private_key *)0x0;
    }
  }
  return local_8;
}

Assistant:

ulp_ring_private_key* ulp_ring_alloc_private_key(size_t n) {
    ulp_ring_private_key* key = malloc(sizeof(ulp_ring_private_key));
    if(key == NULL)
        return NULL;
    key->n = n;
    key->s = malloc(n*sizeof(key->q));
    if(key->s == NULL) {
        free(key);
        return NULL;
    }
    return key;
}